

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_decoder_isac_t_impl.h
# Opt level: O2

void __thiscall
webrtc::AudioDecoderIsacT<webrtc::IsacFloat>::~AudioDecoderIsacT
          (AudioDecoderIsacT<webrtc::IsacFloat> *this)

{
  string *result;
  int16_t local_182;
  FatalMessage local_180;
  
  local_180.stream_ = (ostringstream)0x0;
  local_180._1_3_ = 0;
  local_182 = WebRtcIsac_Free(this->isac_state_);
  result = rtc::CheckEQImpl<int,short>((int *)&local_180,&local_182,"0 == T::Free(isac_state_)");
  if (result == (string *)0x0) {
    rtc::scoped_refptr<webrtc::LockedIsacBandwidthInfo>::~scoped_refptr(&this->bwinfo_);
    return;
  }
  rtc::FatalMessage::FatalMessage
            (&local_180,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_coding/codecs/isac/audio_decoder_isac_t_impl.h"
             ,0x27,result);
  rtc::FatalMessage::~FatalMessage(&local_180);
}

Assistant:

AudioDecoderIsacT<T>::~AudioDecoderIsacT() {
  RTC_CHECK_EQ(0, T::Free(isac_state_));
}